

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O3

void anon_unknown.dwarf_3e8f::test_intersect(void **param_1)

{
  _Bool _Var1;
  roaring64_bitmap_t *prVar2;
  roaring64_bitmap_t *prVar3;
  
  prVar2 = roaring64_bitmap_create();
  prVar3 = roaring64_bitmap_create();
  roaring64_bitmap_add(prVar2,50000);
  roaring64_bitmap_add(prVar2,100000);
  roaring64_bitmap_add(prVar2,0x186a1);
  roaring64_bitmap_add(prVar2,200000);
  roaring64_bitmap_add(prVar2,300000);
  roaring64_bitmap_add(prVar2,40000);
  roaring64_bitmap_add(prVar3,0x186a1);
  roaring64_bitmap_add(prVar2,400000);
  _Var1 = roaring64_bitmap_intersect(prVar2,prVar3);
  _assert_true((ulong)_Var1,"roaring64_bitmap_intersect(r1, r2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x45f);
  roaring64_bitmap_free(prVar2);
  roaring64_bitmap_free(prVar3);
  prVar2 = roaring64_bitmap_create();
  prVar3 = roaring64_bitmap_create();
  roaring64_bitmap_add(prVar2,50000);
  roaring64_bitmap_add(prVar2,100000);
  roaring64_bitmap_add(prVar2,0x186a1);
  roaring64_bitmap_add(prVar2,200000);
  roaring64_bitmap_add(prVar2,300000);
  roaring64_bitmap_add(prVar2,40000);
  roaring64_bitmap_add(prVar2,400000);
  _Var1 = roaring64_bitmap_intersect(prVar2,prVar3);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_intersect(r1, r2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x471);
  roaring64_bitmap_free(prVar2);
  roaring64_bitmap_free(prVar3);
  return;
}

Assistant:

DEFINE_TEST(test_intersect) {
    {
        roaring64_bitmap_t* r1 = roaring64_bitmap_create();
        roaring64_bitmap_t* r2 = roaring64_bitmap_create();

        roaring64_bitmap_add(r1, 50000);
        roaring64_bitmap_add(r1, 100000);
        roaring64_bitmap_add(r1, 100001);
        roaring64_bitmap_add(r1, 200000);
        roaring64_bitmap_add(r1, 300000);

        roaring64_bitmap_add(r1, 40000);
        roaring64_bitmap_add(r2, 100001);
        roaring64_bitmap_add(r1, 400000);

        assert_true(roaring64_bitmap_intersect(r1, r2));

        roaring64_bitmap_free(r1);
        roaring64_bitmap_free(r2);
    }
    {
        roaring64_bitmap_t* r1 = roaring64_bitmap_create();
        roaring64_bitmap_t* r2 = roaring64_bitmap_create();

        roaring64_bitmap_add(r1, 50000);
        roaring64_bitmap_add(r1, 100000);
        roaring64_bitmap_add(r1, 100001);
        roaring64_bitmap_add(r1, 200000);
        roaring64_bitmap_add(r1, 300000);

        roaring64_bitmap_add(r1, 40000);
        roaring64_bitmap_add(r1, 400000);

        assert_false(roaring64_bitmap_intersect(r1, r2));

        roaring64_bitmap_free(r1);
        roaring64_bitmap_free(r2);
    }
}